

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_or(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  array_container_t *src_1;
  array_container_t *src_2;
  run_container_t *prVar2;
  container_t *pcVar3;
  bitset_container_t *dst;
  array_container_t *paVar4;
  byte local_32;
  byte local_31;
  run_container_t *local_30;
  
  local_32 = type2;
  local_31 = type1;
  src_1 = (array_container_t *)container_unwrap_shared(c1,&local_31);
  src_2 = (array_container_t *)container_unwrap_shared(c2,&local_32);
  local_30 = (run_container_t *)0x0;
  switch((uint)local_32 + (uint)local_31 * 4) {
  case 5:
    dst = bitset_container_create();
    bitset_container_or((bitset_container_t *)src_1,(bitset_container_t *)src_2,dst);
    goto LAB_00109911;
  case 6:
    dst = bitset_container_create();
    paVar4 = src_1;
    break;
  case 7:
    _Var1 = run_container_is_full((run_container_t *)src_2);
    if (_Var1) {
      prVar2 = run_container_create();
      *result_type = '\x03';
LAB_001098e1:
      run_container_copy((run_container_t *)src_2,prVar2);
      return prVar2;
    }
    dst = bitset_container_create();
    paVar4 = src_1;
    goto LAB_00109909;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1470,
                  "container_t *container_or(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    dst = bitset_container_create();
    paVar4 = src_2;
    src_2 = src_1;
    break;
  case 10:
    _Var1 = array_array_container_union(src_1,src_2,&local_30);
    *result_type = '\x02' - _Var1;
    return local_30;
  case 0xb:
    prVar2 = run_container_create();
    paVar4 = src_2;
    goto LAB_0010987f;
  case 0xd:
    _Var1 = run_container_is_full((run_container_t *)src_1);
    if (_Var1) {
      prVar2 = run_container_create();
      *result_type = '\x03';
      src_2 = src_1;
      goto LAB_001098e1;
    }
    dst = bitset_container_create();
    paVar4 = src_2;
    src_2 = src_1;
LAB_00109909:
    run_bitset_container_union((run_container_t *)src_2,(bitset_container_t *)paVar4,dst);
    goto LAB_00109911;
  case 0xe:
    prVar2 = run_container_create();
    paVar4 = src_1;
    src_1 = src_2;
LAB_0010987f:
    array_run_container_union(src_1,(run_container_t *)paVar4,prVar2);
LAB_00109887:
    pcVar3 = convert_run_to_efficient_container_and_free(prVar2,result_type);
    return pcVar3;
  case 0xf:
    prVar2 = run_container_create();
    run_container_union((run_container_t *)src_1,(run_container_t *)src_2,prVar2);
    *result_type = '\x03';
    goto LAB_00109887;
  }
  array_bitset_container_union(src_2,(bitset_container_t *)paVar4,dst);
LAB_00109911:
  *result_type = '\x01';
  return dst;
}

Assistant:

static inline container_t *container_or(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            result = bitset_container_create();
            bitset_container_or(const_CAST_bitset(c1),
                                const_CAST_bitset(c2),
                                CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_union(
                                const_CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            result = run_container_create();
            run_container_union(const_CAST_run(c1),
                                const_CAST_run(c2),
                                CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // todo: could be optimized since will never convert to array
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = bitset_container_create();
            array_bitset_container_union(const_CAST_array(c2),
                                         const_CAST_bitset(c1),
                                         CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = bitset_container_create();
            array_bitset_container_union(const_CAST_array(c1),
                                         const_CAST_bitset(c2),
                                         CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c2),
                                   CAST_run(result));
                return result;
            }
            result = bitset_container_create();
            run_bitset_container_union(const_CAST_run(c2),
                                       const_CAST_bitset(c1),
                                       CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            if (run_container_is_full(const_CAST_run(c1))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c1),
                                   CAST_run(result));
                return result;
            }
            result = bitset_container_create();
            run_bitset_container_union(const_CAST_run(c1),
                                       const_CAST_bitset(c2),
                                       CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c1),
                                      const_CAST_run(c2),
                                      CAST_run(result));
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c2),
                                      const_CAST_run(c1),
                                      CAST_run(result));
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}